

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::InsertRuleLauncher(cmLocalGenerator *this,string *s,cmTarget *target,string *prop)

{
  char *pcVar1;
  ostream *poVar2;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream wrapped;
  char *val;
  string *prop_local;
  cmTarget *target_local;
  string *s_local;
  cmLocalGenerator *this_local;
  
  pcVar1 = GetRuleLauncher(this,target,prop);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,pcVar1);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)s);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)s,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return;
}

Assistant:

void cmLocalGenerator::InsertRuleLauncher(std::string& s, cmTarget* target,
                                          const std::string& prop)
{
  if(const char* val = this->GetRuleLauncher(target, prop))
    {
    std::ostringstream wrapped;
    wrapped << val << " " << s;
    s = wrapped.str();
    }
}